

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

stumpless_target * stumpless_open_sqlite3_target_with_options(char *name,int flags,char *vfs)

{
  int code;
  stumpless_target *target;
  sqlite3_target *psVar1;
  sqlite3 *db;
  sqlite3 *local_28;
  
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else {
    target = new_target(STUMPLESS_SQLITE3_TARGET,name);
    if (target != (stumpless_target *)0x0) {
      local_28 = (sqlite3 *)0x0;
      code = sqlite3_open_v2(name,&local_28,flags,vfs);
      if (code == 0) {
        psVar1 = new_sqlite3_target(local_28);
        target->id = psVar1;
        if (psVar1 != (sqlite3_target *)0x0) {
          stumpless_set_current_target(target);
          return target;
        }
      }
      else {
        raise_sqlite3_failure("could not open the sqlite3 database",code);
      }
      sqlite3_close(local_28);
      destroy_target(target);
    }
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_sqlite3_target_with_options( const char *name,
                                            int flags,
                                            const char *vfs ) {
  struct stumpless_target *target;
  sqlite3 *db;
  int sql_result;

  VALIDATE_ARG_NOT_NULL( name );

  target = new_target( STUMPLESS_SQLITE3_TARGET, name );

  if( !target ) {
    goto fail;
  }

  db = NULL;
  sql_result = sqlite3_open_v2( name, &db, flags, vfs );
  if( sql_result != SQLITE_OK ) {
    raise_sqlite3_failure( L10N_SQLITE3_OPEN_FAILED_ERROR_MESSAGE, sql_result );
    goto fail_db;
  }

  target->id = new_sqlite3_target( db );
  if( !target->id ) {
    goto fail_db;
  }

  stumpless_set_current_target( target );
  return target;

fail_db:
  sqlite3_close( db );
  destroy_target( target );
fail:
  return NULL;
}